

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O1

int Lodtalk::SmallInteger::stLess(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  uVar3 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  if (((uVar2 & 1) != 0) && ((uVar3 & 1) != 0)) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x13])
                      (interpreter,
                       (ulong)(CONCAT44(extraout_var_00,uVar2) >> 1 <
                              CONCAT44(extraout_var_01,uVar3) >> 1));
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int SmallInteger::stLess(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isSmallInteger() || !b.isSmallInteger())
        return interpreter->primitiveFailed();

    auto ia = a.decodeSmallInteger();
    auto ib = b.decodeSmallInteger();
    return interpreter->returnBoolean(ia < ib);
}